

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O3

void R_CreatePlayerTranslation
               (float h,float s,float v,FPlayerColorSet *colorset,FPlayerSkin *skin,
               FRemapTable *table,FRemapTable *alttable,FRemapTable *pillartable)

{
  byte bVar1;
  BYTE BVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  FMemLump FVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  PalEntry *__src;
  PalEntry *__dest;
  int iVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  float in_XMM1_Db;
  float v_00;
  float in_XMM2_Db;
  float fVar15;
  float b;
  float g;
  float r;
  float fg;
  float fr;
  float ph;
  float pv;
  float ps;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  ulong local_b8;
  float local_ac;
  FRemapTable *local_a8;
  ulong local_a0;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  FMemLump local_68;
  float local_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  float fStack_40;
  float fStack_3c;
  float local_34;
  
  bVar1 = skin->range0start;
  uVar13 = (ulong)bVar1;
  bVar11 = skin->range0end;
  uVar12 = (ulong)bVar11;
  local_ac = s;
  local_bc = v;
  local_c0 = h;
  local_88 = v;
  fStack_84 = in_XMM2_Db;
  local_78 = s;
  fStack_74 = in_XMM1_Db;
  local_48 = pillartable;
  if (skin->othergame == false) {
    lVar8 = (long)table->NumEntries;
    if (0 < lVar8) {
      lVar5 = 0;
      do {
        table->Remap[lVar5] = (BYTE)lVar5;
        lVar5 = lVar5 + 1;
        lVar8 = (long)table->NumEntries;
      } while (lVar5 < lVar8);
    }
    __dest = table->Palette;
    __src = GPalette.BaseColors;
  }
  else {
    memcpy(table->Remap,OtherGameSkinRemap,(long)table->NumEntries);
    __dest = table->Palette;
    lVar8 = (long)table->NumEntries;
    __src = OtherGameSkinPalette;
  }
  memcpy(__dest,__src,lVar8 << 2);
  if (1 < table->NumEntries) {
    lVar8 = 1;
    do {
      table->Palette[lVar8].field_0.field_0.a = 0xff;
      lVar8 = lVar8 + 1;
    } while (lVar8 < table->NumEntries);
  }
  if (bVar11 == 0 && bVar1 == 0) {
    table->Inactive = true;
    if (table->Native == (FNativePalette *)0x0) {
      return;
    }
    (*table->Native->_vptr_FNativePalette[2])();
    return;
  }
  table->Inactive = false;
  if (colorset == (FPlayerColorSet *)0x0) {
LAB_00334164:
    uVar9 = (uint)bVar1;
    iVar4 = (bVar11 - uVar9) + 1;
    fVar15 = (float)iVar4;
    if ((gameinfo.gametype & GAME_DoomStrifeChex) == GAME_Any) {
      if (gameinfo.gametype == GAME_Hexen) {
        local_bc = 0.1;
        if (0.1 <= local_88) {
          local_bc = local_88;
        }
        if (sprites.Array[skin->sprite].field_0.dwName == 0x59414c50) {
          iVar4 = 0;
          local_b8 = uVar13;
          if (bVar1 <= bVar11) {
            local_a8 = alttable;
            local_a0 = uVar12;
            do {
              HSVtoRGB(&local_c4,&local_c8,&local_cc,local_c0,local_78,
                       *(float *)(&DAT_005e19f0 + (long)(iVar4 / (int)fVar15) * 4) * local_88);
              SetRemap(table,(int)uVar13,local_c4,local_c8,local_cc);
              uVar9 = (int)uVar13 + 1;
              uVar13 = (ulong)uVar9;
              iVar4 = iVar4 + 9;
              alttable = local_a8;
            } while (bVar11 + 1 != uVar9);
LAB_00334707:
            iVar4 = 0;
            bVar11 = (byte)local_a0;
            uVar13 = local_b8;
          }
        }
        else {
          iVar4 = 0;
          local_b8 = uVar13;
          if (bVar1 <= bVar11) {
            local_a8 = alttable;
            local_a0 = uVar12;
            do {
              HSVtoRGB(&local_c4,&local_c8,&local_cc,local_c0,
                       *(float *)(&DAT_005e1a20 + (long)(iVar4 / (int)fVar15) * 4) * local_78,
                       *(float *)(&DAT_005e1a70 + (long)(iVar4 / (int)fVar15) * 4) * local_88);
              SetRemap(table,(int)uVar13,local_c4,local_c8,local_cc);
              uVar9 = (int)uVar13 + 1;
              uVar13 = (ulong)uVar9;
              iVar4 = iVar4 + 0x12;
              alttable = local_a8;
            } while (bVar11 + 1 != uVar9);
            goto LAB_00334707;
          }
        }
      }
      else {
        if (gameinfo.gametype == GAME_Heretic) {
          local_b8 = uVar13;
          local_a8 = alttable;
          local_a0 = uVar12;
          if (bVar1 <= bVar11) {
            local_58 = local_88 + -0.2352937;
            local_98 = 1.0 / fVar15;
            iVar10 = 0;
            do {
              local_bc = (float)iVar10 * 0.418916 * local_98 + local_58;
              if (1.0 <= local_bc) {
                local_bc = 1.0;
              }
              if (local_bc <= 0.0) {
                local_bc = 0.0;
              }
              HSVtoRGB(&local_c4,&local_c8,&local_cc,local_c0,local_78,local_bc);
              SetRemap(table,(uint)bVar1 + iVar10,local_c4,local_c8,local_cc);
              iVar10 = iVar10 + 1;
            } while (iVar4 != iVar10);
          }
          if (local_a8 == (FRemapTable *)0x0) goto LAB_003348eb;
          local_78 = local_78 * 1.3;
          if (1.0 <= local_78) {
            local_78 = 1.0;
          }
          local_88 = local_88 * 1.3;
          if (1.0 <= local_88) {
            local_88 = 1.0;
          }
          lVar8 = 0;
          do {
            local_ac = (float)((int)lVar8 + -0x10) * -0.0962 + 0.8965;
            if (local_78 <= local_ac) {
              local_ac = local_78;
            }
            lVar5 = lVar8 + 1;
            local_bc = ((float)(int)lVar5 * 0.0489 + 0.2102) * local_88;
            if (1.0 <= local_bc) {
              local_bc = 1.0;
            }
            local_98 = local_bc;
            local_58 = local_ac;
            HSVtoRGB(&local_c4,&local_c8,&local_cc,local_c0,local_ac,local_bc);
            SetRemap(local_a8,(int)lVar8 + 0x91,local_c4,local_c8,local_cc);
            local_8c = (float)GPalette.BaseColors[lVar8 + 0x91].field_0.field_0.r * 0.003921569;
            local_90 = (float)GPalette.BaseColors[lVar8 + 0x91].field_0.field_0.g * 0.003921569;
            local_94 = (float)GPalette.BaseColors[lVar8 + 0x91].field_0.field_0.b * 0.003921569;
            RGBtoHSV(local_8c,local_90,local_94,(float *)&local_68,&local_34,&local_5c);
            HSVtoRGB(&local_8c,&local_90,&local_94,local_c0,local_58,local_5c * 0.8 + local_98 * 0.2
                    );
            iVar4 = (int)(local_8c * 255.0);
            if (0xfe < iVar4) {
              iVar4 = 0xff;
            }
            if (iVar4 < 1) {
              iVar4 = 0;
            }
            iVar10 = (int)(local_90 * 255.0);
            if (0xfe < iVar10) {
              iVar10 = 0xff;
            }
            if (iVar10 < 1) {
              iVar10 = 0;
            }
            uVar9 = (uint)(local_94 * 255.0);
            if (0xfe < (int)uVar9) {
              uVar9 = 0xff;
            }
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            BVar2 = FColorMatcher::Pick(&ColorMatcher,iVar4,iVar10,uVar9);
            alttable = local_a8;
            local_48->Remap[lVar8 + 0x91] = BVar2;
            local_48->Palette[lVar8 + 0x91].field_0 =
                 (anon_union_4_2_12391d7c_for_PalEntry_0)
                 (iVar10 << 8 | iVar4 << 0x10 | uVar9 | 0xff000000);
            lVar8 = lVar5;
          } while (lVar5 != 0x18);
          if (local_a8->Native != (FNativePalette *)0x0) {
            (*local_a8->Native->_vptr_FNativePalette[2])();
          }
          goto LAB_00334707;
        }
        iVar4 = 0;
        local_b8 = uVar13;
      }
    }
    else {
      local_ac = local_78 + -0.23;
      local_bc = local_88 + 0.1;
      fStack_74 = fStack_74 + 0.0;
      fStack_84 = fStack_84 + 0.0;
      if (bVar1 <= bVar11) {
        fVar15 = 1.0 / fVar15;
        local_58 = fVar15 * 0.23;
        fStack_54 = fVar15 * 0.94112;
        fStack_50 = fVar15 * 0.0;
        fStack_4c = fVar15 * 0.0;
        local_b8 = uVar13;
        local_a8 = alttable;
        local_a0 = uVar12;
        do {
          fVar15 = local_ac;
          if (1.0 <= local_ac) {
            fVar15 = 1.0;
          }
          if (fVar15 <= 0.0) {
            fVar15 = 0.0;
          }
          local_48 = (FRemapTable *)CONCAT44(local_bc,local_ac);
          v_00 = local_bc;
          if (1.0 <= local_bc) {
            v_00 = 1.0;
          }
          if (v_00 <= 0.0) {
            v_00 = 0.0;
          }
          fStack_40 = fStack_74;
          fStack_3c = fStack_84;
          HSVtoRGB(&local_c4,&local_c8,&local_cc,local_c0,fVar15,v_00);
          SetRemap(table,uVar9,local_c4,local_c8,local_cc);
          local_ac = (float)local_48 + local_58;
          fStack_74 = fStack_40 + fStack_50;
          fStack_84 = fStack_3c + fStack_4c;
          local_bc = local_48._4_4_ - fStack_54;
          uVar9 = uVar9 + 1;
          alttable = local_a8;
        } while (bVar11 + 1 != uVar9);
        goto LAB_00334707;
      }
      iVar4 = 0;
    }
  }
  else {
    if (colorset->Lump < 0) {
LAB_003345b6:
      local_b8 = uVar13;
      bVar14 = SetRange(table,(uint)bVar1,(uint)bVar11,(uint)colorset->FirstColor,
                        (uint)colorset->LastColor);
      if (colorset->NumExtraRanges != '\0') {
        uVar13 = 0;
        do {
          bVar3 = SetRange(table,(uint)colorset->Extra[uVar13].RangeStart,
                           (uint)colorset->Extra[uVar13].RangeEnd,
                           (uint)colorset->Extra[uVar13].FirstColor,
                           (uint)colorset->Extra[uVar13].LastColor);
          bVar14 = (bool)(bVar14 & bVar3);
          uVar13 = uVar13 + 1;
        } while (uVar13 < colorset->NumExtraRanges);
      }
    }
    else {
      iVar4 = FWadCollection::LumpLength(&Wads,colorset->Lump);
      if (iVar4 < 0x100) goto LAB_00334164;
      if (colorset->Lump < 0) goto LAB_003345b6;
      FWadCollection::ReadLump((FWadCollection *)&local_68,0x1c70340);
      FVar6.Block.Chars = (FString)(FString)(char *)0x0;
      if (*(int *)((long)local_68.Block.Chars + -0xc) != 0) {
        FVar6.Block.Chars = local_68.Block.Chars;
      }
      bVar14 = true;
      if (bVar1 <= bVar11) {
        uVar7 = uVar13;
        do {
          table->Remap[uVar7] = GPalette.Remap[*(byte *)((long)FVar6.Block.Chars + uVar7)];
          bVar14 = (bool)(bVar14 & uVar7 == *(byte *)((long)FVar6.Block.Chars + uVar7));
          table->Palette[uVar7].field_0 = GPalette.BaseColors[table->Remap[uVar7]].field_0;
          table->Palette[uVar7].field_0.field_0.a = 0xff;
          uVar7 = uVar7 + 1;
        } while (uVar12 + 1 != uVar7);
      }
      local_b8 = uVar13;
      FMemLump::~FMemLump(&local_68);
    }
    table->Inactive = bVar14;
    iVar4 = 1;
    uVar13 = local_b8;
  }
  if ((alttable != (FRemapTable *)0x0) && (gameinfo.gametype == GAME_Hexen)) {
    if (((byte)iVar4 & (char)uVar13 == -0x5c & bVar11 == 0xb9) == 0) {
      lVar8 = 0xa4;
      do {
        RGBtoHSV((float)GPalette.BaseColors[lVar8].field_0.field_0.r * 0.003921569,
                 (float)GPalette.BaseColors[lVar8].field_0.field_0.g * 0.003921569,
                 (float)GPalette.BaseColors[lVar8].field_0.field_0.b * 0.003921569,
                 (float *)&local_68,&local_ac,&local_bc);
        HSVtoRGB(&local_c4,&local_c8,&local_cc,local_c0,local_ac * local_78,local_bc * local_88);
        SetRemap(alttable,(int)lVar8,local_c4,local_c8,local_cc);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0xba);
    }
    else {
      FRemapTable::operator=(alttable,table);
    }
    if (alttable->Native != (FNativePalette *)0x0) {
      (*alttable->Native->_vptr_FNativePalette[2])();
    }
  }
LAB_003348eb:
  if (table->Native != (FNativePalette *)0x0) {
    (*table->Native->_vptr_FNativePalette[2])();
  }
  return;
}

Assistant:

static void R_CreatePlayerTranslation (float h, float s, float v, const FPlayerColorSet *colorset,
	FPlayerSkin *skin, FRemapTable *table, FRemapTable *alttable, FRemapTable *pillartable)
{
	int i;
	BYTE start = skin->range0start;
	BYTE end = skin->range0end;
	float r, g, b;
	float bases, basev;
	float sdelta, vdelta;
	float range;

	// Set up the base translation for this skin. If the skin was created
	// for the current game, then this is just an identity translation.
	// Otherwise, it remaps the colors from the skin's original palette to
	// the current one.
	if (skin->othergame)
	{
		memcpy (table->Remap, OtherGameSkinRemap, table->NumEntries);
		memcpy (table->Palette, OtherGameSkinPalette, sizeof(*table->Palette) * table->NumEntries);
	}
	else
	{
		for (i = 0; i < table->NumEntries; ++i)
		{
			table->Remap[i] = i;
		}
		memcpy(table->Palette, GPalette.BaseColors, sizeof(*table->Palette) * table->NumEntries);
	}
	for (i = 1; i < table->NumEntries; ++i)
	{
		table->Palette[i].a = 255;
	}

	// [GRB] Don't translate skins with color range 0-0 (APlayerPawn default)
	if (start == 0 && end == 0)
	{
		table->Inactive = true;
		table->UpdateNative();
		return;
	}

	table->Inactive = false;
	range = (float)(end-start+1);

	bases = s;
	basev = v;

	if (colorset != NULL && colorset->Lump >= 0 && Wads.LumpLength(colorset->Lump) < 256)
	{ // Bad table length. Ignore it.
		colorset = NULL;
	}

	if (colorset != NULL)
	{
		bool identity = true;
		// Use the pre-defined range instead of a custom one.
		if (colorset->Lump < 0)
		{
			identity &= SetRange(table, start, end, colorset->FirstColor, colorset->LastColor);
			for (i = 0; i < colorset->NumExtraRanges; ++i)
			{
				identity &= SetRange(table,
					colorset->Extra[i].RangeStart, colorset->Extra[i].RangeEnd,
					colorset->Extra[i].FirstColor, colorset->Extra[i].LastColor);
			}
		}
		else
		{
			FMemLump translump = Wads.ReadLump(colorset->Lump);
			const BYTE *trans = (const BYTE *)translump.GetMem();
			for (i = start; i <= end; ++i)
			{
				table->Remap[i] = GPalette.Remap[trans[i]];
				identity &= (trans[i] == i);
				table->Palette[i] = GPalette.BaseColors[table->Remap[i]];
				table->Palette[i].a = 255;
			}
		}
		// If the colorset created an identity translation mark it as inactive
		table->Inactive = identity;
	}
	else if (gameinfo.gametype & GAME_DoomStrifeChex)
	{
		// Build player sprite translation
		s -= 0.23f;
		v += 0.1f;
		sdelta = 0.23f / range;
		vdelta = -0.94112f / range;

		for (i = start; i <= end; i++)
		{
			float uses, usev;
			uses = clamp (s, 0.f, 1.f);
			usev = clamp (v, 0.f, 1.f);
			HSVtoRGB (&r, &g, &b, h, uses, usev);
			SetRemap(table, i, r, g, b);
			s += sdelta;
			v += vdelta;
		}
	}
	else if (gameinfo.gametype == GAME_Heretic)
	{
		float vdelta = 0.418916f / range;

		// Build player sprite translation
		for (i = start; i <= end; i++)
		{
			v = vdelta * (float)(i - start) + basev - 0.2352937f;
			v = clamp (v, 0.f, 1.f);
			HSVtoRGB (&r, &g, &b, h, s, v);
			SetRemap(table, i, r, g, b);
		}

		// Build rain/lifegem translation
		if (alttable)
		{
			bases = MIN (bases*1.3f, 1.f);
			basev = MIN (basev*1.3f, 1.f);
			for (i = 145; i <= 168; i++)
			{
				s = MIN (bases, 0.8965f - 0.0962f*(float)(i - 161));
				v = MIN (1.f, (0.2102f + 0.0489f*(float)(i - 144)) * basev);
				HSVtoRGB (&r, &g, &b, h, s, v);
				SetRemap(alttable, i, r, g, b);
				SetPillarRemap(pillartable, i, h, s, v);
			}
			alttable->UpdateNative();
		}
	}
	else if (gameinfo.gametype == GAME_Hexen)
	{
		if (memcmp (sprites[skin->sprite].name, "PLAY", 4) == 0)
		{ // The fighter is different! He gets a brown hairy loincloth, but the other
		  // two have blue capes.
			float vs[9] = { .28f, .32f, .38f, .42f, .47f, .5f, .58f, .71f, .83f };

			// Build player sprite translation
			//h = 45.f;
			v = MAX (0.1f, v);

			for (i = start; i <= end; i++)
			{
				HSVtoRGB (&r, &g, &b, h, s, vs[(i-start)*9/(int)range]*basev);
				SetRemap(table, i, r, g, b);
			}
		}
		else
		{
			float ms[18] = { .95f, .96f, .89f, .97f, .97f, 1.f, 1.f, 1.f, .97f, .99f, .87f, .77f, .69f, .62f, .57f, .47f, .43f };
			float mv[18] = { .16f, .19f, .22f, .25f, .31f, .35f, .38f, .41f, .47f, .54f, .60f, .65f, .71f, .77f, .83f, .89f, .94f, 1.f };

			// Build player sprite translation
			v = MAX (0.1f, v);

			for (i = start; i <= end; i++)
			{
				HSVtoRGB (&r, &g, &b, h, ms[(i-start)*18/(int)range]*bases, mv[(i-start)*18/(int)range]*basev);
				SetRemap(table, i, r, g, b);
			}
		}
	}
	if (gameinfo.gametype == GAME_Hexen && alttable != NULL)
	{
		// Build Hexen's lifegem translation.
		
		// Is the player's translation range the same as the gem's and we are using a
		// predefined translation? If so, then use the same one for the gem. Otherwise,
		// build one as per usual.
		if (colorset != NULL && start == 164 && end == 185)
		{
			*alttable = *table;
		}
		else
		{
			for (i = 164; i <= 185; ++i)
			{
				const PalEntry *base = &GPalette.BaseColors[i];
				float dummy;

				RGBtoHSV (base->r/255.f, base->g/255.f, base->b/255.f, &dummy, &s, &v);
				HSVtoRGB (&r, &g, &b, h, s*bases, v*basev);
				SetRemap(alttable, i, r, g, b);
			}
		}
		alttable->UpdateNative();
	}
	table->UpdateNative();
}